

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_string_rep(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  int32_t iVar4;
  TRef TVar5;
  IRRef1 IVar6;
  
  TVar1 = lj_ir_tostr(J,*J->base);
  TVar2 = lj_opt_narrow_toint(J,J->base[1]);
  TVar5 = 0;
  if ((J->base[2] & 0x1f000000) != 0) {
    TVar3 = lj_ir_tostr(J,J->base[2]);
    iVar4 = argv2int(J,rd->argv + 1);
    TVar5 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = (ushort)(1 < iVar4) << 8 | 0x293;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
    lj_opt_fold(J);
    TVar5 = 0;
    if (1 < iVar4) {
      TVar5 = lj_ir_kptr_(J,IR_KPTR,&J[-1].penalty[0x2f].val);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
      TVar5 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5784;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar5 = lj_opt_fold(J);
    }
  }
  TVar3 = lj_ir_kptr_(J,IR_KPTR,&J[-1].penalty[0x2f].val);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
  TVar3 = lj_opt_fold(J);
  IVar6 = (IRRef1)TVar3;
  if (TVar5 != 0) {
    (J->fold).ins.field_0.ot = 0x5689;
    (J->fold).ins.field_0.op1 = IVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar3 = lj_opt_fold(J);
    TVar1 = lj_ir_kint(J,-1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar2 = lj_opt_fold(J);
    TVar1 = TVar5;
  }
  TVar1 = lj_ir_call(J,IRCALL_lj_buf_putstr_rep,(ulong)TVar3,(ulong)TVar1,(ulong)TVar2);
  (J->fold).ins.field_0.ot = 0x5784;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = IVar6;
  TVar1 = lj_opt_fold(J);
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_rep(jit_State *J, RecordFFData *rd)
{
  TRef str = lj_ir_tostr(J, J->base[0]);
  TRef rep = lj_opt_narrow_toint(J, J->base[1]);
  TRef hdr, tr, str2 = 0;
  if (!tref_isnil(J->base[2])) {
    TRef sep = lj_ir_tostr(J, J->base[2]);
    int32_t vrep = argv2int(J, &rd->argv[1]);
    emitir(IRTGI(vrep > 1 ? IR_GT : IR_LE), rep, lj_ir_kint(J, 1));
    if (vrep > 1) {
      TRef hdr2 = recff_bufhdr(J);
      TRef tr2 = emitir(IRTG(IR_BUFPUT, IRT_PGC), hdr2, sep);
      tr2 = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr2, str);
      str2 = emitir(IRTG(IR_BUFSTR, IRT_STR), tr2, hdr2);
    }
  }
  tr = hdr = recff_bufhdr(J);
  if (str2) {
    tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, str);
    str = str2;
    rep = emitir(IRTI(IR_ADD), rep, lj_ir_kint(J, -1));
  }
  tr = lj_ir_call(J, IRCALL_lj_buf_putstr_rep, tr, str, rep);
  J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
}